

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeLockingScript::DecodeLockingScript
          (DecodeLockingScript *this,DecodeLockingScript *param_2)

{
  JsonClassBase<cfd::api::json::DecodeLockingScript> *in_RSI;
  JsonClassBase<cfd::api::json::DecodeLockingScript> *in_RDI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  string *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  string *this_01;
  
  core::JsonClassBase<cfd::api::json::DecodeLockingScript>::JsonClassBase(in_RDI,in_RSI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodeLockingScript_0057f3b0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string((string *)(in_RDI + 7),(string *)(in_RSI + 7));
  this_01 = (string *)(in_RDI + 0xb);
  std::__cxx11::string::string(this_01,(string *)(in_RSI + 0xb));
  *(undefined4 *)&in_RDI[0xf]._vptr_JsonClassBase = *(undefined4 *)&in_RSI[0xf]._vptr_JsonClassBase;
  this_00 = (string *)(in_RDI + 0x10);
  std::__cxx11::string::string(this_00,(string *)(in_RSI + 0x10));
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_01,
                    (JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
  return;
}

Assistant:

DecodeLockingScript() {
    CollectFieldName();
  }